

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

MatrixXd * __thiscall lf::base::RefEl::NodeCoords(RefEl *this)

{
  runtime_error *this_00;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  RefEl *local_18;
  RefEl *this_local;
  
  switch(this->type_) {
  case kPoint:
    this_local = (RefEl *)ncoords_point_dynamic_;
    break;
  case kSegment:
    this_local = (RefEl *)ncoords_segment_dynamic_;
    break;
  case kTria:
    this_local = (RefEl *)ncoords_tria_dynamic_;
    break;
  case kQuad:
    this_local = (RefEl *)ncoords_quad_dynamic_;
    break;
  default:
    local_18 = this;
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"RefEl::NodeCoords() not implemented for this RefEl type.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"false",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/base/ref_el.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    AssertionFailed(&local_1d0,&local_1f8,0xfd,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (MatrixXd *)this_local;
}

Assistant:

[[nodiscard]] const Eigen::MatrixXd& NodeCoords() const {
    switch (type_) {
      case RefElType::kPoint:
        return ncoords_point_dynamic_;
      case RefElType::kSegment:
        return ncoords_segment_dynamic_;
      case RefElType::kTria:
        return ncoords_tria_dynamic_;
      case RefElType::kQuad:
        return ncoords_quad_dynamic_;
      default:
        LF_VERIFY_MSG(
            false, "RefEl::NodeCoords() not implemented for this RefEl type.");
    }
  }